

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::NativeString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  string *psVar2;
  allocator<char> local_41;
  string local_40;
  
  if (field == (FieldDef *)0x0) {
    pVVar1 = (Value *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"cpp_str_type",&local_41)
    ;
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(field->super_Definition).attributes,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  psVar2 = (string *)&(this->opts_).super_IDLOptions.cpp_object_api_string_type;
  if (pVVar1 != (Value *)0x0) {
    psVar2 = (string *)&pVVar1->constant;
  }
  if (*(long *)(psVar2 + 8) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"std::string",(allocator<char> *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string NativeString(const FieldDef *field) {
    auto attr = field ? field->attributes.Lookup("cpp_str_type") : nullptr;
    auto &ret = attr ? attr->constant : opts_.cpp_object_api_string_type;
    if (ret.empty()) { return "std::string"; }
    return ret;
  }